

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.h
# Opt level: O0

size_t __thiscall SectHdrsWrapper::getSecIndex(SectHdrsWrapper *this,SectionHdrWrapper *sec)

{
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  __normal_iterator<ExeNodeWrapper_*const_*,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
  local_38;
  __normal_iterator<ExeNodeWrapper_*const_*,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
  local_30;
  const_iterator itr;
  size_t indx;
  SectionHdrWrapper *sec_local;
  SectHdrsWrapper *this_local;
  
  if ((sec != (SectionHdrWrapper *)0x0) &&
     (sVar2 = std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::size
                        (&(this->super_PENodeWrapper).super_ExeNodeWrapper.entries), sVar2 != 0)) {
    itr._M_current = (ExeNodeWrapper **)0x0;
    local_30._M_current =
         (ExeNodeWrapper **)
         std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::begin
                   (&(this->super_PENodeWrapper).super_ExeNodeWrapper.entries);
    while( true ) {
      local_38._M_current =
           (ExeNodeWrapper **)
           std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::end
                     (&(this->super_PENodeWrapper).super_ExeNodeWrapper.entries);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar1) {
        return (size_t)itr._M_current;
      }
      ppEVar3 = __gnu_cxx::
                __normal_iterator<ExeNodeWrapper_*const_*,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
                ::operator*(&local_30);
      if (sec == (SectionHdrWrapper *)*ppEVar3) break;
      __gnu_cxx::
      __normal_iterator<ExeNodeWrapper_*const_*,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
      ::operator++(&local_30);
      itr._M_current = itr._M_current + 1;
    }
    return (size_t)itr._M_current;
  }
  return SECT_INVALID_INDEX;
}

Assistant:

size_t getSecIndex(SectionHdrWrapper* sec) const
    {
        if (!sec || !entries.size()) return SECT_INVALID_INDEX;
        size_t indx = 0;
        for (auto itr = entries.begin(); itr != entries.end(); ++itr, ++indx) {
            if (sec == *itr) {
                return indx;
            }
        }
        return indx;
    }